

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLEntityDecl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XMLEntityDecl::XMLEntityDecl
          (XMLEntityDecl *this,XMLCh *entName,XMLCh value,MemoryManager *manager)

{
  short sVar1;
  int iVar2;
  short *psVar3;
  undefined4 extraout_var;
  XMLCh *__dest;
  undefined6 in_register_00000012;
  short *psVar4;
  size_t __n;
  XMLCh dummy [2];
  CleanupType_conflict10 cleanup;
  undefined4 local_3c;
  JanitorMemFunCall<xercesc_4_0::XMLEntityDecl> local_38;
  undefined4 extraout_var_00;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XMLEntityDecl_00408138;
  this->fId = 0;
  this->fValueLen = 1;
  this->fValue = (XMLCh *)0x0;
  this->fName = (XMLCh *)0x0;
  this->fNotationName = (XMLCh *)0x0;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fBaseURI = (XMLCh *)0x0;
  this->fIsExternal = false;
  this->fMemoryManager = manager;
  local_38.fObject = this;
  local_38.fToCall = (MFPT)cleanUp;
  local_38._16_8_ = 0;
  psVar4 = (short *)((long)&local_3c + 2);
  local_3c = (uint)(ushort)value;
  psVar3 = psVar4;
  if ((int)CONCAT62(in_register_00000012,value) != 0) {
    do {
      psVar4 = psVar3 + 1;
      sVar1 = *psVar3;
      psVar3 = psVar4;
    } while (sVar1 != 0);
  }
  iVar2 = (*manager->_vptr_MemoryManager[3])(manager,(long)psVar4 - (long)&local_3c);
  memcpy((XMLCh *)CONCAT44(extraout_var,iVar2),&local_3c,(long)psVar4 - (long)&local_3c);
  this->fValue = (XMLCh *)CONCAT44(extraout_var,iVar2);
  if (entName == (XMLCh *)0x0) {
    __dest = (XMLCh *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar4 = (short *)((long)entName + __n);
      __n = __n + 2;
    } while (*psVar4 != 0);
    iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
    memcpy(__dest,entName,__n);
  }
  this->fName = __dest;
  local_38.fObject = (XMLEntityDecl *)0x0;
  JanitorMemFunCall<xercesc_4_0::XMLEntityDecl>::~JanitorMemFunCall(&local_38);
  return;
}

Assistant:

XMLEntityDecl::XMLEntityDecl(const  XMLCh* const   entName
                            , const XMLCh          value
                            , MemoryManager* const manager) :
    fId(0)
    , fValueLen(1)
    , fValue(0)
    , fName(0)
    , fNotationName(0)
    , fPublicId(0)
    , fSystemId(0)
    , fBaseURI(0)
    , fIsExternal(false)
    , fMemoryManager(manager)
{
    CleanupType cleanup(this, &XMLEntityDecl::cleanUp);

    try
    {
        XMLCh dummy[2] = { chNull, chNull };
        dummy[0] = value;
        fValue = XMLString::replicate(dummy, fMemoryManager);
        fName = XMLString::replicate(entName, fMemoryManager);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}